

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.cpp
# Opt level: O2

void Diligent::ValidateTopLevelASDesc(TopLevelASDesc *Desc)

{
  char *pcVar1;
  char *local_10;
  
  if (Desc->CompactedSize == 0) {
    if (Desc->MaxInstanceCount == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_10 = "";
      if (pcVar1 != (char *)0x0) {
        local_10 = pcVar1;
      }
      LogError<true,char[32],char_const*,char[15],char[35]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x35,(char (*) [32])"Description of a top-level AS \'",&local_10,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [35])"MaxInstanceCount must not be zero.");
    }
    if ((~Desc->Flags & 0xc) == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_10 = "";
      if (pcVar1 != (char *)0x0) {
        local_10 = pcVar1;
      }
      LogError<true,char[32],char_const*,char[15],char[110]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x3a,(char (*) [32])"Description of a top-level AS \'",&local_10,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [110])
                 "RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive."
                );
    }
  }
  else {
    if (Desc->MaxInstanceCount != 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_10 = "";
      if (pcVar1 != (char *)0x0) {
        local_10 = pcVar1;
      }
      LogError<true,char[32],char_const*,char[15],char[71]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x29,(char (*) [32])"Description of a top-level AS \'",&local_10,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [71])
                 "If non-zero CompactedSize is specified, MaxInstanceCount must be zero.");
    }
    if (Desc->Flags != RAYTRACING_BUILD_AS_NONE) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_10 = "";
      if (pcVar1 != (char *)0x0) {
        local_10 = pcVar1;
      }
      LogError<true,char[32],char_const*,char[15],char[80]>
                (false,"ValidateTopLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TopLevelASBase.cpp"
                 ,0x2e,(char (*) [32])"Description of a top-level AS \'",&local_10,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [80])
                 "If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
    }
  }
  return;
}

Assistant:

void ValidateTopLevelASDesc(const TopLevelASDesc& Desc) noexcept(false)
{
#define LOG_TLAS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of a top-level AS '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    if (Desc.CompactedSize > 0)
    {
        if (Desc.MaxInstanceCount != 0)
        {
            LOG_TLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, MaxInstanceCount must be zero.");
        }

        if (Desc.Flags != RAYTRACING_BUILD_AS_NONE)
        {
            LOG_TLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
        }
    }
    else
    {
        if (Desc.MaxInstanceCount == 0)
        {
            LOG_TLAS_ERROR_AND_THROW("MaxInstanceCount must not be zero.");
        }

        if ((Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_TRACE) != 0 && (Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_BUILD) != 0)
        {
            LOG_TLAS_ERROR_AND_THROW("RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive.");
        }
    }

#undef LOG_TLAS_ERROR_AND_THROW
}